

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdFindLargeBox_rec(Kit_DsdNtk_t *pNtk,int Id,int Size)

{
  ushort uVar1;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  ulong uVar4;
  uint uVar5;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if (Id < (int)((uint)pNtk->nNodes + (uint)uVar1)) {
      uVar5 = 0;
      if (Id < (int)(uint)uVar1) {
        pKVar3 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar3 = pNtk->pNodes[(long)Id - (ulong)uVar1];
      }
      if (((pKVar3 != (Kit_DsdObj_t *)0x0) &&
          (uVar5 = 1, ((uint)*pKVar3 & 0x1c0) != 0x140 || (int)((uint)*pKVar3 >> 0x1a) <= Size)) &&
         (uVar5 = 0, 0x3ffffff < (uint)*pKVar3)) {
        uVar4 = 0;
        uVar5 = 0;
        do {
          uVar2 = Kit_DsdFindLargeBox_rec
                            (pNtk,(uint)(*(ushort *)((long)&pKVar3[1].field_0x0 + uVar4 * 2) >> 1),
                             Size);
          uVar5 = uVar5 | uVar2;
          uVar4 = uVar4 + 1;
        } while (uVar4 < (uint)*pKVar3 >> 0x1a);
      }
      return uVar5;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdFindLargeBox_rec( Kit_DsdNtk_t * pNtk, int Id, int Size )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_PRIME && (int)pObj->nFans > Size )
        return 1;
    RetValue = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue |= Kit_DsdFindLargeBox_rec( pNtk, Abc_Lit2Var(iLit), Size );
    return RetValue;
}